

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O0

void __thiscall
cmCTestBuildHandler::GenerateXMLLogScraped(cmCTestBuildHandler *this,cmXMLWriter *xml)

{
  cmCTest *this_00;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  string *psVar6;
  bool local_37a;
  allocator<char> local_351;
  string local_350;
  allocator<char> local_329;
  string local_328;
  allocator<char> local_301;
  string local_300;
  allocator<char> local_2d9;
  string local_2d8;
  allocator<char> local_2b1;
  string local_2b0;
  allocator<char> local_289;
  string local_288;
  string local_268;
  string local_248;
  string local_228 [32];
  long local_208;
  size_type p;
  RegularExpression *local_1e0;
  RegularExpression *re;
  cmCTestCompileErrorWarningRex *rit;
  iterator __end3;
  iterator __begin3;
  vector<cmCTestBuildHandler::cmCTestCompileErrorWarningRex,_std::allocator<cmCTestBuildHandler::cmCTestCompileErrorWarningRex>_>
  *__range3;
  string local_1b0;
  allocator<char> local_189;
  string local_188;
  allocator<char> local_161;
  string local_160;
  reference local_140;
  cmCTestBuildErrorWarning *cm;
  cmCTestBuildErrorWarning *local_130;
  cmAlphaNum local_128;
  string local_f8;
  cmAlphaNum local_d8;
  string local_a8;
  allocator<char> local_71;
  string local_70;
  undefined1 local_50 [8];
  string srcdir;
  int numWarningsAllowed;
  int numErrorsAllowed;
  iterator it;
  vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
  *ew;
  cmXMLWriter *xml_local;
  cmCTestBuildHandler *this_local;
  
  it._M_current = (cmCTestBuildErrorWarning *)&this->ErrorsAndWarnings;
  __gnu_cxx::
  __normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
  ::__normal_iterator((__normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
                       *)&numWarningsAllowed);
  srcdir.field_2._12_4_ = this->MaxErrors;
  srcdir.field_2._8_4_ = this->MaxWarnings;
  this_00 = (this->super_cmCTestGenericHandler).CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"SourceDirectory",&local_71);
  cmCTest::GetCTestConfiguration((string *)local_50,this_00,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  cmsys::SystemTools::CollapseFullPath(&local_f8,(string *)local_50);
  cmAlphaNum::cmAlphaNum(&local_d8,&local_f8);
  cmAlphaNum::cmAlphaNum(&local_128,'/');
  cmStrCat<>(&local_a8,&local_d8,&local_128);
  std::__cxx11::string::operator=((string *)local_50,(string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_f8);
  local_130 = (cmCTestBuildErrorWarning *)
              std::
              vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
              ::begin(it._M_current);
  _numWarningsAllowed = (iterator)local_130;
  do {
    cm = (cmCTestBuildErrorWarning *)
         std::
         vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
         ::end(it._M_current);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
                        *)&numWarningsAllowed,
                       (__normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
                        *)&cm);
    local_37a = false;
    if (bVar1) {
      local_37a = srcdir.field_2._12_4_ != 0 || srcdir.field_2._8_4_ != 0;
    }
    if (!local_37a) {
      std::__cxx11::string::~string((string *)local_50);
      return;
    }
    local_140 = __gnu_cxx::
                __normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
                ::operator*((__normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
                             *)&numWarningsAllowed);
    if ((((local_140->Error & 1U) != 0) && (srcdir.field_2._12_4_ != 0)) ||
       (((local_140->Error & 1U) == 0 && (srcdir.field_2._8_4_ != 0)))) {
      if ((local_140->Error & 1U) == 0) {
        srcdir.field_2._8_4_ = srcdir.field_2._8_4_ + -1;
      }
      else {
        srcdir.field_2._12_4_ = srcdir.field_2._12_4_ + -1;
      }
      pcVar3 = "Warning";
      if ((local_140->Error & 1U) != 0) {
        pcVar3 = "Error";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,pcVar3,&local_161);
      cmXMLWriter::StartElement(xml,&local_160);
      std::__cxx11::string::~string((string *)&local_160);
      std::allocator<char>::~allocator(&local_161);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_188,"BuildLogLine",&local_189);
      cmXMLWriter::Element<int>(xml,&local_188,&local_140->LogLine);
      std::__cxx11::string::~string((string *)&local_188);
      std::allocator<char>::~allocator(&local_189);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1b0,"Text",(allocator<char> *)((long)&__range3 + 7));
      cmXMLWriter::Element<std::__cxx11::string>(xml,&local_1b0,&local_140->Text);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
      __end3 = std::
               vector<cmCTestBuildHandler::cmCTestCompileErrorWarningRex,_std::allocator<cmCTestBuildHandler::cmCTestCompileErrorWarningRex>_>
               ::begin(&this->ErrorWarningFileLineRegex);
      rit = (cmCTestCompileErrorWarningRex *)
            std::
            vector<cmCTestBuildHandler::cmCTestCompileErrorWarningRex,_std::allocator<cmCTestBuildHandler::cmCTestCompileErrorWarningRex>_>
            ::end(&this->ErrorWarningFileLineRegex);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<cmCTestBuildHandler::cmCTestCompileErrorWarningRex_*,_std::vector<cmCTestBuildHandler::cmCTestCompileErrorWarningRex,_std::allocator<cmCTestBuildHandler::cmCTestCompileErrorWarningRex>_>_>
                                         *)&rit), bVar1) {
        re = (RegularExpression *)
             __gnu_cxx::
             __normal_iterator<cmCTestBuildHandler::cmCTestCompileErrorWarningRex_*,_std::vector<cmCTestBuildHandler::cmCTestCompileErrorWarningRex,_std::allocator<cmCTestBuildHandler::cmCTestCompileErrorWarningRex>_>_>
             ::operator*(&__end3);
        local_1e0 = &((reference)re)->RegularExpression;
        bVar1 = cmsys::RegularExpression::find(local_1e0,&local_140->Text);
        if (bVar1) {
          cmsys::RegularExpression::match_abi_cxx11_
                    ((string *)&p,local_1e0,*(int *)(re->regmatch).startp);
          std::__cxx11::string::operator=((string *)&local_140->SourceFile,(string *)&p);
          std::__cxx11::string::~string((string *)&p);
          cmsys::SystemTools::ConvertToUnixSlashes(&local_140->SourceFile);
          lVar4 = std::__cxx11::string::find((char *)&local_140->SourceFile,0xd12d60);
          if (lVar4 == -1) {
            cmsys::SystemTools::CollapseFullPath(&local_248,&local_140->SourceFile);
            std::__cxx11::string::operator=((string *)&local_140->SourceFile,(string *)&local_248);
            std::__cxx11::string::~string((string *)&local_248);
            psVar6 = &local_140->SourceFile;
            pcVar3 = (char *)std::__cxx11::string::c_str();
            cmsys::SystemTools::ReplaceString(psVar6,pcVar3,"");
          }
          else {
            cmsys::SystemTools::ReplaceString(&local_140->SourceFile,"/.../","");
            local_208 = std::__cxx11::string::find((char)local_140 + '(',0x2f);
            if (local_208 != -1) {
              psVar6 = &local_140->SourceFile;
              std::__cxx11::string::size();
              std::__cxx11::string::substr((ulong)local_228,(ulong)psVar6);
              std::__cxx11::string::operator=((string *)&local_140->SourceFile,local_228);
              std::__cxx11::string::~string(local_228);
            }
          }
          cmsys::RegularExpression::match_abi_cxx11_
                    (&local_268,local_1e0,*(int *)((long)(re->regmatch).startp + 4));
          pcVar3 = (char *)std::__cxx11::string::c_str();
          iVar2 = atoi(pcVar3);
          local_140->LineNumber = iVar2;
          std::__cxx11::string::~string((string *)&local_268);
          break;
        }
        __gnu_cxx::
        __normal_iterator<cmCTestBuildHandler::cmCTestCompileErrorWarningRex_*,_std::vector<cmCTestBuildHandler::cmCTestCompileErrorWarningRex,_std::allocator<cmCTestBuildHandler::cmCTestCompileErrorWarningRex>_>_>
        ::operator++(&__end3);
      }
      uVar5 = std::__cxx11::string::empty();
      if (((uVar5 & 1) == 0) && (-1 < local_140->LineNumber)) {
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_288,"SourceFile",&local_289);
          cmXMLWriter::Element<std::__cxx11::string>(xml,&local_288,&local_140->SourceFile);
          std::__cxx11::string::~string((string *)&local_288);
          std::allocator<char>::~allocator(&local_289);
        }
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2b0,"SourceFileTail",&local_2b1);
          cmXMLWriter::Element<std::__cxx11::string>(xml,&local_2b0,&local_140->SourceFileTail);
          std::__cxx11::string::~string((string *)&local_2b0);
          std::allocator<char>::~allocator(&local_2b1);
        }
        if (-1 < local_140->LineNumber) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2d8,"SourceLineNumber",&local_2d9);
          cmXMLWriter::Element<int>(xml,&local_2d8,&local_140->LineNumber);
          std::__cxx11::string::~string((string *)&local_2d8);
          std::allocator<char>::~allocator(&local_2d9);
        }
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_300,"PreContext",&local_301);
      cmXMLWriter::Element<std::__cxx11::string>(xml,&local_300,&local_140->PreContext);
      std::__cxx11::string::~string((string *)&local_300);
      std::allocator<char>::~allocator(&local_301);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_328,"PostContext",&local_329);
      cmXMLWriter::StartElement(xml,&local_328);
      std::__cxx11::string::~string((string *)&local_328);
      std::allocator<char>::~allocator(&local_329);
      cmXMLWriter::Content<std::__cxx11::string>(xml,&local_140->PostContext);
      if ((((local_140->Error & 1U) != 0) && (srcdir.field_2._12_4_ == 0)) ||
         (((local_140->Error & 1U) == 0 && (srcdir.field_2._8_4_ == 0)))) {
        cmXMLWriter::Content<char[72]>
                  (xml,(char (*) [72])
                       "\nThe maximum number of reported warnings or errors has been reached!!!\n");
      }
      cmXMLWriter::EndElement(xml);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_350,"RepeatCount",&local_351);
      cmXMLWriter::Element<char[2]>(xml,&local_350,(char (*) [2])0xd4c353);
      std::__cxx11::string::~string((string *)&local_350);
      std::allocator<char>::~allocator(&local_351);
      cmXMLWriter::EndElement(xml);
    }
    __gnu_cxx::
    __normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
    ::operator++((__normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
                  *)&numWarningsAllowed,0);
  } while( true );
}

Assistant:

void cmCTestBuildHandler::GenerateXMLLogScraped(cmXMLWriter& xml)
{
  std::vector<cmCTestBuildErrorWarning>& ew = this->ErrorsAndWarnings;
  std::vector<cmCTestBuildErrorWarning>::iterator it;

  // only report the first 50 warnings and first 50 errors
  int numErrorsAllowed = this->MaxErrors;
  int numWarningsAllowed = this->MaxWarnings;
  std::string srcdir = this->CTest->GetCTestConfiguration("SourceDirectory");
  // make sure the source dir is in the correct case on windows
  // via a call to collapse full path.
  srcdir = cmStrCat(cmSystemTools::CollapseFullPath(srcdir), '/');
  for (it = ew.begin();
       it != ew.end() && (numErrorsAllowed || numWarningsAllowed); it++) {
    cmCTestBuildErrorWarning* cm = &(*it);
    if ((cm->Error && numErrorsAllowed) ||
        (!cm->Error && numWarningsAllowed)) {
      if (cm->Error) {
        numErrorsAllowed--;
      } else {
        numWarningsAllowed--;
      }
      xml.StartElement(cm->Error ? "Error" : "Warning");
      xml.Element("BuildLogLine", cm->LogLine);
      xml.Element("Text", cm->Text);
      for (cmCTestCompileErrorWarningRex& rit :
           this->ErrorWarningFileLineRegex) {
        cmsys::RegularExpression* re = &rit.RegularExpression;
        if (re->find(cm->Text)) {
          cm->SourceFile = re->match(rit.FileIndex);
          // At this point we need to make this->SourceFile relative to
          // the source root of the project, so cvs links will work
          cmSystemTools::ConvertToUnixSlashes(cm->SourceFile);
          if (cm->SourceFile.find("/.../") != std::string::npos) {
            cmSystemTools::ReplaceString(cm->SourceFile, "/.../", "");
            std::string::size_type p = cm->SourceFile.find('/');
            if (p != std::string::npos) {
              cm->SourceFile =
                cm->SourceFile.substr(p + 1, cm->SourceFile.size() - p);
            }
          } else {
            // make sure it is a full path with the correct case
            cm->SourceFile = cmSystemTools::CollapseFullPath(cm->SourceFile);
            cmSystemTools::ReplaceString(cm->SourceFile, srcdir.c_str(), "");
          }
          cm->LineNumber = atoi(re->match(rit.LineIndex).c_str());
          break;
        }
      }
      if (!cm->SourceFile.empty() && cm->LineNumber >= 0) {
        if (!cm->SourceFile.empty()) {
          xml.Element("SourceFile", cm->SourceFile);
        }
        if (!cm->SourceFileTail.empty()) {
          xml.Element("SourceFileTail", cm->SourceFileTail);
        }
        if (cm->LineNumber >= 0) {
          xml.Element("SourceLineNumber", cm->LineNumber);
        }
      }
      xml.Element("PreContext", cm->PreContext);
      xml.StartElement("PostContext");
      xml.Content(cm->PostContext);
      // is this the last warning or error, if so notify
      if ((cm->Error && !numErrorsAllowed) ||
          (!cm->Error && !numWarningsAllowed)) {
        xml.Content("\nThe maximum number of reported warnings or errors "
                    "has been reached!!!\n");
      }
      xml.EndElement(); // PostContext
      xml.Element("RepeatCount", "0");
      xml.EndElement(); // "Error" / "Warning"
    }
  }
}